

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O1

JsErrorCode WScriptJsrt::ReportModuleCompletionCallback(JsModuleRecord module,JsValueRef exception)

{
  AutoString local_48;
  void *local_20;
  JsValueRef specifier;
  
  if (exception != (JsValueRef)0x0) {
    local_20 = (JsValueRef)0x0;
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetModuleHostInfo)
              (module,JsModuleHostInfo_Url,&local_20);
    local_48.length = 0;
    local_48.data._0_5_ = 0;
    local_48.data._5_3_ = 0;
    local_48.data_wide._0_5_ = 0;
    local_48._21_8_ = 0;
    AutoString::Initialize(&local_48,local_20);
    PrintException((LPCSTR)CONCAT35(local_48.data._5_3_,local_48.data._0_5_),JsErrorScriptException,
                   exception);
    AutoString::~AutoString(&local_48);
  }
  return JsNoError;
}

Assistant:

JsErrorCode WScriptJsrt::ReportModuleCompletionCallback(JsModuleRecord module, JsValueRef exception)
{
    if (exception != nullptr)
    {
        JsValueRef specifier = JS_INVALID_REFERENCE;
        ChakraRTInterface::JsGetModuleHostInfo(module, JsModuleHostInfo_Url, &specifier);
        PrintException(AutoString(specifier).GetString(), JsErrorCode::JsErrorScriptException, exception);
    }
    return JsNoError;
}